

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set_test.cpp
# Opt level: O0

void __thiscall
adt_set_test_DefaultConstructor_Test::TestBody(adt_set_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  int *remove_value_1;
  size_t i_5;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  int *value_2;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  int *value_3;
  size_t i_4;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  size_t i_3;
  set s_1;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  int *remove_value;
  size_t i_2;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  int *value;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int *value_1;
  size_t i_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  size_t i;
  AssertionResult gtest_ar_1;
  set s;
  AssertionResult gtest_ar;
  AssertionResult *in_stack_fffffffffffffa30;
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  char *in_stack_fffffffffffffa40;
  AssertionResult *in_stack_fffffffffffffa48;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined4 local_3d0;
  int local_3cc;
  AssertionResult local_3c8;
  AssertHelper local_3b8;
  Message local_3b0;
  undefined4 local_3a8;
  int local_3a4;
  AssertionResult local_3a0;
  undefined4 *local_390;
  ulong local_388;
  AssertHelper local_380;
  Message local_378;
  undefined8 local_370;
  undefined8 local_368;
  AssertionResult local_360;
  AssertHelper local_350;
  Message local_348;
  undefined4 local_340;
  int local_33c;
  AssertionResult local_338;
  undefined4 *local_328;
  AssertHelper local_320;
  Message local_318;
  undefined4 local_310;
  undefined4 local_30c;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e8;
  int local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined4 *local_2c0;
  undefined8 local_2b8;
  AssertionResult local_2b0;
  undefined4 *local_2a0;
  ulong local_298;
  AssertHelper local_290;
  Message local_288;
  undefined8 local_280;
  size_t local_278;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  undefined4 local_250;
  undefined4 local_24c;
  AssertionResult local_248;
  ulong local_238;
  undefined8 local_230;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_218;
  int local_214;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1f0;
  int local_1ec;
  AssertionResult local_1e8;
  undefined4 *local_1d8;
  ulong local_1d0;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined4 local_188;
  int local_184;
  AssertionResult local_180;
  undefined4 *local_170;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_158;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_130;
  int local_12c;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 *local_108;
  undefined8 local_100;
  AssertionResult local_f8;
  undefined4 *local_e8;
  ulong local_e0;
  AssertHelper local_d8;
  Message local_d0;
  undefined8 local_c8;
  size_t local_c0;
  AssertionResult local_b8;
  AssertHelper local_a8;
  Message local_a0;
  undefined4 local_98;
  undefined4 local_94;
  AssertionResult local_90;
  ulong local_80;
  AssertHelper local_78;
  Message local_70;
  undefined8 local_68;
  undefined8 local_60;
  AssertionResult local_58;
  undefined8 local_48;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  uVar2 = log_policy_format_text();
  uVar3 = log_policy_schedule_sync();
  uVar4 = log_policy_storage_sequential();
  uVar5 = log_policy_stream_stdio(_stdout);
  local_20 = log_configure_impl("metacall",4,uVar2,uVar3,uVar4,uVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (int *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10bbe5);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x48,pcVar6);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10bc48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bca0);
  local_48 = set_create(hash_callback_str,comparable_callback_str);
  local_60 = 0x3f;
  local_68 = 0x3f;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (unsigned_long *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10bd75);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x6f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x10bdd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10be30);
  for (local_80 = 0; local_80 < 0x3f; local_80 = local_80 + 1) {
    local_94 = 0;
    local_98 = set_insert(local_48,TestBody::key_array + local_80,TestBody::value_array + local_80);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
               (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
               (int *)in_stack_fffffffffffffa30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10bf33);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0x74,pcVar6);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::Message::~Message((Message *)0x10bf96);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bfeb);
  }
  set_iterate(local_48,set_cb_iterate_str_to_int,0);
  local_c0 = iterator_counter;
  local_c8 = 0x3f;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (unsigned_long *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c0d9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x79,pcVar6);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x10c13c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c194);
  for (local_e0 = 0; local_e0 < 0x3f; local_e0 = local_e0 + 1) {
    local_108 = (undefined4 *)set_get(local_48,TestBody::key_array + local_e0);
    local_100 = 0;
    local_e8 = local_108;
    testing::internal::CmpHelperNE<int*,int*>
              (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
               (int **)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
               (int **)in_stack_fffffffffffffa30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c29e);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0x80,pcVar6);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message((Message *)0x10c301);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c359);
    local_12c = TestBody::value_array[local_e0];
    local_130 = *local_e8;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
               (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
               (int *)in_stack_fffffffffffffa30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c425);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0x82,pcVar6);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message((Message *)0x10c488);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c4dd);
  }
  local_154 = 0;
  local_158 = set_insert(local_48,0x1887a7,TestBody::value_array);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (int *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c5c5);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x86,pcVar6);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x10c628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c680);
  local_170 = (undefined4 *)set_get(local_48,0x1887a7);
  local_184 = TestBody::value_array[0];
  local_188 = *local_170;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (int *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c75c);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x8a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message((Message *)0x10c7bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c817);
  local_1b0 = 0x3f;
  local_1b8 = set_size(local_48);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (unsigned_long *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c8da);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x8c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    testing::Message::~Message((Message *)0x10c93d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c995);
  for (local_1d0 = 0; local_1d0 < 0x3f; local_1d0 = local_1d0 + 1) {
    local_1d8 = (undefined4 *)set_remove(local_48,TestBody::key_array + local_1d0);
    if (local_1d0 == 1) {
      local_1ec = TestBody::value_array[0];
      local_1f0 = *local_1d8;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
                 (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                 (int *)in_stack_fffffffffffffa30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10caa7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                   ,0x95,pcVar6);
        testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        testing::Message::~Message((Message *)0x10cb0a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cb5f);
    }
    else {
      local_214 = TestBody::value_array[local_1d0];
      local_218 = *local_1d8;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
                 (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                 (int *)in_stack_fffffffffffffa30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
      if (!bVar1) {
        testing::Message::Message(&local_220);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10cc30);
        testing::internal::AssertHelper::AssertHelper
                  (&local_228,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                   ,0x99,pcVar6);
        testing::internal::AssertHelper::operator=(&local_228,&local_220);
        testing::internal::AssertHelper::~AssertHelper(&local_228);
        testing::Message::~Message((Message *)0x10cc93);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cce8);
    }
  }
  set_destroy(local_48);
  local_230 = set_create(hash_callback_ptr,comparable_callback_ptr);
  for (local_238 = 0; local_238 < 0x3f; local_238 = local_238 + 1) {
    local_24c = 0;
    local_250 = set_insert(local_230,TestBody()::key_array + local_238,
                           TestBody()::value_array + local_238);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
               (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
               (int *)in_stack_fffffffffffffa30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10ce27);
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0xb7,pcVar6);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      testing::Message::~Message((Message *)0x10ce8a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cedf);
  }
  set_iterate(local_230,set_cb_iterate_ptr_to_int,0);
  local_278 = iterator_counter_ptr;
  local_280 = 0x3f;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (unsigned_long *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10cfcd);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0xbc,pcVar6);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message((Message *)0x10d030);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d088);
  for (local_298 = 0; local_298 < 0x3f; local_298 = local_298 + 1) {
    local_2c0 = (undefined4 *)set_get(local_230,TestBody()::key_array + local_298);
    local_2b8 = 0;
    local_2a0 = local_2c0;
    testing::internal::CmpHelperNE<int*,int*>
              (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
               (int **)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
               (int **)in_stack_fffffffffffffa30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
    if (!bVar1) {
      testing::Message::Message(&local_2c8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10d189);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0xc3,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::Message::~Message((Message *)0x10d1ec);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d244);
    local_2e4 = TestBody()::value_array[local_298];
    local_2e8 = *local_2a0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
               (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
               (int *)in_stack_fffffffffffffa30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10d310);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0xc5,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message((Message *)0x10d36d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d3c2);
  }
  local_30c = 0;
  local_310 = set_insert(local_230,0x188bb4,TestBody()::value_array);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (int *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10d49e);
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0xc9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    testing::Message::~Message((Message *)0x10d4fb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d553);
  local_328 = (undefined4 *)set_get(local_230,0x188bb4);
  local_33c = TestBody()::value_array[0];
  local_340 = *local_328;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (int *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10d623);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0xcd,pcVar6);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message((Message *)0x10d680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d6d5);
  local_368 = 0x3f;
  local_370 = set_size(local_230);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             (unsigned_long *)in_stack_fffffffffffffa30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10d78c);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0xcf,pcVar6);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message((Message *)0x10d7e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d841);
  for (local_388 = 0; local_388 < 0x3f; local_388 = local_388 + 1) {
    local_390 = (undefined4 *)set_remove(local_230,TestBody()::key_array + local_388);
    if (local_388 == 1) {
      local_3a4 = TestBody()::value_array[0];
      local_3a8 = *local_390;
      in_stack_fffffffffffffa48 = &local_3a0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
                 (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                 (int *)in_stack_fffffffffffffa30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffa48);
      if (!bVar1) {
        testing::Message::Message(&local_3b0);
        in_stack_fffffffffffffa40 =
             testing::AssertionResult::failure_message((AssertionResult *)0x10d94a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                   ,0xd8,in_stack_fffffffffffffa40);
        testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
        testing::internal::AssertHelper::~AssertHelper(&local_3b8);
        testing::Message::~Message((Message *)0x10d9a7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d9fc);
    }
    else {
      local_3cc = TestBody()::value_array[local_388];
      local_3d0 = *local_390;
      in_stack_fffffffffffffa30 = &local_3c8;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (&in_stack_fffffffffffffa48->success_,in_stack_fffffffffffffa40,
                 (int *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                 (int *)in_stack_fffffffffffffa30);
      in_stack_fffffffffffffa3f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffa30);
      if (!(bool)in_stack_fffffffffffffa3f) {
        testing::Message::Message(&local_3d8);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10dac1);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                   ,0xdc,pcVar6);
        testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3e0);
        testing::Message::~Message((Message *)0x10db1c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10db71);
    }
  }
  set_destroy(local_230);
  return;
}

Assistant:

TEST_F(adt_set_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	/* Hash String */
	{
		set s = set_create(&hash_callback_str, &comparable_callback_str);

		static key_str key_array[] = {
			"aaaaaa", "aaaaab", "aaaaba", "aaaabb",
			"aaabaa", "aaabab", "aaabba", "aaabbb",
			"aabaaa", "aabaab", "aababa", "aababb",
			"aabbaa", "aabbab", "aabbba", "aabbbb",
			"abaaaa", "abaaab", "abaaba", "abaabb",
			"ababaa", "ababab", "ababbb", "abbaaa",
			"abbaab", "abbaba", "abbabb", "abbbaa",
			"abbbab", "abbbba", "abbbbb", "baaaaa",
			"baaaab", "baaaba", "baaabb", "baabaa",
			"baabab", "baabba", "baabbb", "babaaa",
			"babaab", "bababa", "bababb", "babbaa",
			"babbab", "babbba", "babbbb", "bbaaaa",
			"bbaaab", "bbaaba", "bbaabb", "bbabaa",
			"bbabab", "bbabba", "bbabbb", "bbbaaa",
			"bbbaab", "bbbaba", "bbbabb", "bbbbaa",
			"bbbbab", "bbbbba", "bbbbbb"
		};

		static const size_t key_array_size = sizeof(key_array) / sizeof(key_array[0]);

		static int value_array[] = {
			10, 11, 12, 13, 14, 15, 16, 17, 18, 19,
			20, 21, 22, 23, 24, 25, 26, 27, 28, 29,
			30, 31, 32, 33, 34, 35, 36, 37, 38, 39,
			40, 41, 42, 43, 44, 45, 46, 47, 48, 49,
			50, 51, 52, 53, 54, 55, 56, 57, 58, 59,
			60, 61, 62, 63, 64, 65, 66, 67, 68, 69,
			70, 71, 72
		};

		static const size_t value_array_size = sizeof(value_array) / sizeof(value_array[0]);

		EXPECT_EQ((size_t)key_array_size, (size_t)value_array_size);

		/* Insert value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			EXPECT_EQ((int)0, (int)set_insert(s, key_array[i], &value_array[i]));
		}

		set_iterate(s, &set_cb_iterate_str_to_int, NULL);

		EXPECT_EQ((size_t)iterator_counter, (size_t)value_array_size);

		/* Get value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			int *value = (int *)set_get(s, key_array[i]);

			EXPECT_NE((int *)NULL, (int *)value);

			EXPECT_EQ((int)value_array[i], (int)*value);
		}

		/* Overwrite value */
		EXPECT_EQ((int)0, (int)set_insert(s, key_array[1], &value_array[0]));

		int *value = (int *)set_get(s, key_array[1]);

		EXPECT_EQ((int)value_array[0], (int)*value);

		EXPECT_EQ((size_t)key_array_size, (size_t)set_size(s));

		/* Remove value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			int *remove_value = (int *)set_remove(s, key_array[i]);

			if (i == 1)
			{
				EXPECT_EQ((int)value_array[0], (int)*remove_value);
			}
			else
			{
				EXPECT_EQ((int)value_array[i], (int)*remove_value);
			}
		}

		set_destroy(s);
	}

	/* Hash Pointer */
	{
		set s = set_create(&hash_callback_ptr, &comparable_callback_ptr);

		static int value_array[] = {
			10, 11, 12, 13, 14, 15, 16, 17, 18, 19,
			20, 21, 22, 23, 24, 25, 26, 27, 28, 29,
			30, 31, 32, 33, 34, 35, 36, 37, 38, 39,
			40, 41, 42, 43, 44, 45, 46, 47, 48, 49,
			50, 51, 52, 53, 54, 55, 56, 57, 58, 59,
			60, 61, 62, 63, 64, 65, 66, 67, 68, 69,
			70, 71, 72
		};

		static const size_t value_array_size = sizeof(value_array) / sizeof(value_array[0]);

		static int key_array[value_array_size] = { 0 };

		static const size_t key_array_size = value_array_size;

		/* Insert value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			EXPECT_EQ((int)0, (int)set_insert(s, &key_array[i], &value_array[i]));
		}

		set_iterate(s, &set_cb_iterate_ptr_to_int, NULL);

		EXPECT_EQ((size_t)iterator_counter_ptr, (size_t)value_array_size);

		/* Get value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			int *value = (int *)set_get(s, &key_array[i]);

			EXPECT_NE((int *)NULL, (int *)value);

			EXPECT_EQ((int)value_array[i], (int)*value);
		}

		/* Overwrite value */
		EXPECT_EQ((int)0, (int)set_insert(s, &key_array[1], &value_array[0]));

		int *value = (int *)set_get(s, &key_array[1]);

		EXPECT_EQ((int)value_array[0], (int)*value);

		EXPECT_EQ((size_t)key_array_size, (size_t)set_size(s));

		/* Remove value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			int *remove_value = (int *)set_remove(s, &key_array[i]);

			if (i == 1)
			{
				EXPECT_EQ((int)value_array[0], (int)*remove_value);
			}
			else
			{
				EXPECT_EQ((int)value_array[i], (int)*remove_value);
			}
		}

		set_destroy(s);
	}
}